

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O3

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  size_t size;
  long lVar13;
  ostream *poVar14;
  HHStateT<1U> *pHVar15;
  HHStatePortable *pHVar16;
  uint64_t *__s;
  byte bVar17;
  HHResult64 result;
  HighwayHashCatT<1U> cat;
  HHStateT<1> state;
  Lanes rotated_keys_1;
  unsigned_long local_270;
  ostream *local_268;
  uint64_t local_260;
  uint64_t uStack_258;
  uint64_t local_250;
  uint64_t uStack_248;
  HighwayHashCatT<1U> local_240;
  HHStatePortable local_180;
  HHStatePortable local_100;
  
  bVar17 = 0;
  if (argc == 2) {
    __s = (uint64_t *)argv[1];
    size = strlen((char *)__s);
    lVar13 = 0;
    do {
      uVar1 = *(undefined4 *)((long)&DAT_00102060 + lVar13);
      uVar2 = *(undefined4 *)((long)&DAT_00102064 + lVar13);
      uVar3 = *(undefined4 *)((long)&DAT_00102068 + lVar13);
      *(undefined4 *)(local_240.buffer_ + lVar13) = uVar2;
      *(undefined4 *)(local_240.buffer_ + lVar13 + 4) = uVar1;
      *(undefined4 *)(local_240.buffer_ + lVar13 + 8) = uVar2;
      *(undefined4 *)(local_240.buffer_ + lVar13 + 0xc) = uVar3;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x20);
    local_180.mul0[2] = 0x13198a2e03707344;
    local_180.mul0[3] = 0x243f6a8885a308d3;
    local_180.mul0[0] = 0xdbe6d5d5fe4cce2f;
    local_180.mul0[1] = 0xa4093822299f31d0;
    local_180.mul1[0] = 0x3bd39e10cb0ef593;
    local_180.mul1[1] = 0xc0acf169b5f18a8c;
    local_180.mul1[2] = 0xbe5466cf34e90c6c;
    local_180.mul1[3] = 0x452821e638d01377;
    lVar13 = 0;
    do {
      uVar10 = *(ulong *)((long)&DAT_00102068 + lVar13);
      uVar11 = *(ulong *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0
                         + lVar13 + 8);
      *(ulong *)((long)local_180.v0 + lVar13) =
           *(ulong *)((long)&DAT_00102060 + lVar13) ^
           *(ulong *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                     lVar13);
      *(ulong *)((long)local_180.v0 + lVar13 + 8) = uVar10 ^ uVar11;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x20);
    lVar13 = 0;
    do {
      uVar10 = *(ulong *)(local_240.buffer_ + lVar13 + 8);
      uVar11 = *(ulong *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1
                         + lVar13 + 8);
      *(ulong *)((long)local_180.v1 + lVar13) =
           *(ulong *)(local_240.buffer_ + lVar13) ^
           *(ulong *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                     lVar13);
      *(ulong *)((long)local_180.v1 + lVar13 + 8) = uVar10 ^ uVar11;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x20);
    highwayhash::HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>
              (&local_180,(char *)__s,size,&local_270);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hash   : ",9);
    local_268 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)local_268 + -0x18) + (char)local_268);
    std::ostream::put((char)local_268);
    std::ostream::flush();
    lVar13 = 0;
    do {
      uVar1 = *(undefined4 *)((long)&DAT_00102060 + lVar13);
      uVar2 = *(undefined4 *)((long)&DAT_00102064 + lVar13);
      uVar3 = *(undefined4 *)((long)&DAT_00102068 + lVar13);
      *(undefined4 *)((long)local_100.v0 + lVar13) = uVar2;
      *(undefined4 *)((long)local_100.v0 + lVar13 + 4) = uVar1;
      *(undefined4 *)((long)local_100.v0 + lVar13 + 8) = uVar2;
      *(undefined4 *)((long)local_100.v0 + lVar13 + 0xc) = uVar3;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x20);
    local_240.state_.mul0[2] = 0x13198a2e03707344;
    local_240.state_.mul0[3] = 0x243f6a8885a308d3;
    local_240.state_.mul0[0] = 0xdbe6d5d5fe4cce2f;
    local_240.state_.mul0[1] = 0xa4093822299f31d0;
    local_240.state_.mul1[0] = 0x3bd39e10cb0ef593;
    local_240.state_.mul1[1] = 0xc0acf169b5f18a8c;
    local_240.state_.mul1[2] = 0xbe5466cf34e90c6c;
    local_240.state_.mul1[3] = 0x452821e638d01377;
    lVar13 = 0;
    do {
      uVar4 = *(uint *)((long)&DAT_00102064 + lVar13);
      uVar5 = *(uint *)((long)&DAT_00102068 + lVar13);
      uVar6 = *(uint *)((long)&DAT_0010206c + lVar13);
      uVar7 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                       lVar13 + 4);
      uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                       lVar13 + 8);
      uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                       lVar13 + 0xc);
      *(uint *)((long)local_240.state_.v0 + lVar13) =
           *(uint *)((long)&DAT_00102060 + lVar13) ^
           *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 +
                    lVar13);
      *(uint *)((long)local_240.state_.v0 + lVar13 + 4) = uVar4 ^ uVar7;
      *(uint *)((long)local_240.state_.v0 + lVar13 + 8) = uVar5 ^ uVar8;
      *(uint *)((long)local_240.state_.v0 + lVar13 + 0xc) = uVar6 ^ uVar9;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x20);
    lVar13 = 0;
    do {
      uVar4 = *(uint *)((long)local_100.v0 + lVar13 + 4);
      uVar5 = *(uint *)((long)local_100.v0 + lVar13 + 8);
      uVar6 = *(uint *)((long)local_100.v0 + lVar13 + 0xc);
      uVar7 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                       lVar13 + 4);
      uVar8 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                       lVar13 + 8);
      uVar9 = *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                       lVar13 + 0xc);
      *(uint *)((long)local_240.state_.v1 + lVar13) =
           *(uint *)((long)local_100.v0 + lVar13) ^
           *(uint *)(highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 +
                    lVar13);
      *(uint *)((long)local_240.state_.v1 + lVar13 + 4) = uVar4 ^ uVar7;
      *(uint *)((long)local_240.state_.v1 + lVar13 + 8) = uVar5 ^ uVar8;
      *(uint *)((long)local_240.state_.v1 + lVar13 + 0xc) = uVar6 ^ uVar9;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x20);
    local_240.buffer_usage_ = 0;
    local_240.buffer_[0] = '\0';
    local_240.buffer_[1] = '\0';
    local_240.buffer_[2] = '\0';
    local_240.buffer_[3] = '\0';
    local_240.buffer_[4] = '\0';
    local_240.buffer_[5] = '\0';
    local_240.buffer_[6] = '\0';
    local_240.buffer_[7] = '\0';
    local_240.buffer_[8] = '\0';
    local_240.buffer_[9] = '\0';
    local_240.buffer_[10] = '\0';
    local_240.buffer_[0xb] = '\0';
    local_240.buffer_[0xc] = '\0';
    local_240.buffer_[0xd] = '\0';
    local_240.buffer_[0xe] = '\0';
    local_240.buffer_[0xf] = '\0';
    local_240.buffer_[0x10] = '\0';
    local_240.buffer_[0x11] = '\0';
    local_240.buffer_[0x12] = '\0';
    local_240.buffer_[0x13] = '\0';
    local_240.buffer_[0x14] = '\0';
    local_240.buffer_[0x15] = '\0';
    local_240.buffer_[0x16] = '\0';
    local_240.buffer_[0x17] = '\0';
    local_240.buffer_[0x18] = '\0';
    local_240.buffer_[0x19] = '\0';
    local_240.buffer_[0x1a] = '\0';
    local_240.buffer_[0x1b] = '\0';
    local_240.buffer_[0x1c] = '\0';
    local_240.buffer_[0x1d] = '\0';
    local_240.buffer_[0x1e] = '\0';
    local_240.buffer_[0x1f] = '\0';
    if (size < 0x20) {
      if (size == 0) {
        local_240.buffer_usage_ = 0;
      }
      else {
        memcpy(&local_240,__s,size);
      }
      local_240.buffer_usage_ = local_240.buffer_usage_ + size;
    }
    else {
      pHVar15 = &local_240.state_;
      pHVar16 = &local_100;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        pHVar16->v0[0] = pHVar15->v0[0];
        pHVar15 = (HHStateT<1U> *)((long)pHVar15 + ((ulong)bVar17 * -2 + 1) * 8);
        pHVar16 = (HHStatePortable *)((long)pHVar16 + (ulong)bVar17 * -0x10 + 8);
      }
      do {
        local_260 = *__s;
        uStack_258 = __s[1];
        local_250 = __s[2];
        uStack_248 = __s[3];
        highwayhash::Portable::HHStatePortable::Update(&local_100,(Lanes *)&local_260);
        __s = __s + 4;
        size = size - 0x20;
      } while (0x1f < size);
      local_240.buffer_usage_ = size;
      pHVar16 = &local_100;
      pHVar15 = &local_240.state_;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        pHVar15->v0[0] = pHVar16->v0[0];
        pHVar16 = (HHStatePortable *)((long)pHVar16 + ((ulong)bVar17 * -2 + 1) * 8);
        pHVar15 = (HHStateT<1U> *)((long)pHVar15 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      if (size != 0) {
        memcpy(&local_240,__s,size);
      }
    }
    highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(&local_240,&local_270);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"HashCat: ",9);
    poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    iVar12 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please provide 1 argument with a text to hash",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

int main(int argc, char* argv[]) {
  // We read from the args on purpose, to ensure a compile time constant will
  // not be used, for verifying assembly on the supported platforms.
  if (argc != 2) {
    std::cout << "Please provide 1 argument with a text to hash" << std::endl;
    return 1;
  }

  // Please use a different key to ensure your hashes aren't identical.
  HH_ALIGNAS(32) const HHKey key = {1, 2, 3, 4};

  // Aligning inputs to 32 bytes may help but is not required.
  const char* in = argv[1];
  const size_t size = strlen(in);

  // Type determines the hash size; can also be HHResult128 or HHResult256.
  HHResult64 result;

  // HH_TARGET_PREFERRED expands to the best specialization available for the
  // CPU detected via compiler flags (e.g. AVX2 #ifdef __AVX2__).
  HHStateT<HH_TARGET_PREFERRED> state(key);
  HighwayHashT(&state, in, size, &result);
  std::cout << "Hash   : " << result << std::endl;

  HighwayHashCatT<HH_TARGET_PREFERRED> cat(key);
  cat.Append(in, size);
  cat.Finalize(&result);
  std::cout << "HashCat: " << result << std::endl;
  return 0;
}